

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  undefined2 uVar10;
  long lVar11;
  char cVar12;
  ulong uVar13;
  ulong *puVar14;
  size_t sVar15;
  byte bVar16;
  undefined1 *puVar17;
  uint uVar18;
  undefined1 *puVar19;
  int iVar20;
  byte *srcBuffer;
  int iVar21;
  ulong uVar22;
  undefined1 *puVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  int in_R9D;
  ulong *puVar27;
  ulong uVar28;
  undefined1 *puVar29;
  ulong uVar30;
  ulong *puVar31;
  ulong uVar32;
  uint uVar33;
  ulong *puVar34;
  uint uVar35;
  undefined1 *puVar36;
  bool bVar37;
  ulong uStack_138;
  ulong uStack_130;
  uint uStack_11c;
  ulong uStack_110;
  ulong *puStack_108;
  ulong *puStack_f8;
  ulong *puStack_e8;
  int iStack_d4;
  BIT_DStream_t BStack_a8;
  ulong *puStack_80;
  void *pvStack_78;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar15 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,in_R9D);
    return sVar15;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar7 = *cSrc;
  uVar22 = (ulong)uVar7;
  uVar8 = *(ushort *)((long)cSrc + 2);
  uVar9 = *(ushort *)((long)cSrc + 4);
  uVar13 = uVar22 + uVar8 + (ulong)uVar9 + 6;
  if (cSrcSize < uVar13) {
    return 0xffffffffffffffec;
  }
  if (uVar7 == 0) {
    return 0xffffffffffffffb8;
  }
  puStack_80 = (ulong *)((long)cSrc + 6);
  puVar34 = (ulong *)((long)cSrc + uVar22 + 6);
  uVar10 = *(undefined2 *)((long)DTable + 2);
  if (uVar7 < 8) {
    uStack_110 = (ulong)*(byte *)puStack_80;
    switch(uVar7) {
    case 7:
      uStack_110 = uStack_110 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
    case 6:
      uStack_110 = uStack_110 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
    case 5:
      uStack_110 = uStack_110 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
    case 4:
      uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
    case 3:
      uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
    case 2:
      uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
    }
    bVar16 = *(byte *)((long)cSrc + uVar22 + 5);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar35 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar35 == 0; uVar35 = uVar35 - 1) {
      }
    }
    uVar35 = (uVar35 ^ 0x1f) + (uint)uVar7 * -8 + 0x29;
    puStack_108 = puStack_80;
  }
  else {
    bVar16 = *(byte *)((long)cSrc + uVar22 + 5);
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_110 = *(ulong *)((long)cSrc + (uVar22 - 2));
    uVar35 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar35 == 0; uVar35 = uVar35 - 1) {
      }
    }
    uVar35 = ~uVar35 + 9;
    puStack_108 = (ulong *)((long)cSrc + (uVar22 - 2));
  }
  if (uVar8 == 0) {
    return 0xffffffffffffffb8;
  }
  puVar27 = (ulong *)((ulong)uVar8 + (long)puVar34);
  if (uVar8 < 8) {
    uStack_130 = (ulong)(byte)*puVar34;
    switch(uVar8) {
    case 7:
      uStack_130 = uStack_130 | (ulong)*(byte *)((long)cSrc + uVar22 + 0xc) << 0x30;
    case 6:
      uStack_130 = uStack_130 + ((ulong)*(byte *)((long)cSrc + uVar22 + 0xb) << 0x28);
    case 5:
      uStack_130 = uStack_130 + ((ulong)*(byte *)((long)cSrc + uVar22 + 10) << 0x20);
    case 4:
      uStack_130 = uStack_130 + (ulong)*(byte *)((long)cSrc + uVar22 + 9) * 0x1000000;
    case 3:
      uStack_130 = uStack_130 + (ulong)*(byte *)((long)cSrc + uVar22 + 8) * 0x10000;
    case 2:
      uStack_130 = uStack_130 + (ulong)*(byte *)((long)cSrc + uVar22 + 7) * 0x100;
    }
    bVar16 = *(byte *)((long)puVar27 + -1);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar33 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = (uVar33 ^ 0x1f) + (uint)uVar8 * -8 + 0x29;
    puStack_f8 = puVar34;
    pvStack_78 = cSrc;
  }
  else {
    bVar16 = *(byte *)((long)puVar27 + -1);
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_130 = puVar27[-1];
    uVar33 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = ~uVar33 + 9;
    puStack_f8 = puVar27 + -1;
  }
  if (uVar9 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar9 + (long)puVar27);
  if (7 < uVar9) {
    bVar16 = srcBuffer[-1];
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_138 = *(ulong *)(srcBuffer + -8);
    uVar18 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uStack_11c = ~uVar18 + 9;
    puStack_e8 = (ulong *)(srcBuffer + -8);
    goto LAB_0074e3eb;
  }
  uStack_138 = (ulong)(byte)*puVar27;
  switch(uVar9) {
  case 2:
    goto LAB_0074e3b1;
  case 3:
    goto LAB_0074e3a7;
  case 4:
    goto LAB_0074e39d;
  case 5:
    goto LAB_0074e392;
  case 6:
    break;
  case 7:
    uStack_138 = uStack_138 | (ulong)*(byte *)((long)puVar27 + 6) << 0x30;
    break;
  default:
    goto switchD_0074e358_default;
  }
  uStack_138 = uStack_138 + ((ulong)*(byte *)((long)puVar27 + 5) << 0x28);
LAB_0074e392:
  uStack_138 = uStack_138 + ((ulong)*(byte *)((long)puVar27 + 4) << 0x20);
LAB_0074e39d:
  uStack_138 = uStack_138 + (ulong)*(byte *)((long)puVar27 + 3) * 0x1000000;
LAB_0074e3a7:
  uStack_138 = uStack_138 + (ulong)*(byte *)((long)puVar27 + 2) * 0x10000;
LAB_0074e3b1:
  uStack_138 = uStack_138 + (ulong)*(byte *)((long)puVar27 + 1) * 0x100;
switchD_0074e358_default:
  bVar16 = srcBuffer[-1];
  if (bVar16 == 0) {
    return 0xffffffffffffffec;
  }
  uVar18 = 0x1f;
  if (bVar16 != 0) {
    for (; bVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
    }
  }
  uStack_11c = (uVar18 ^ 0x1f) + (uint)uVar9 * -8 + 0x29;
  puStack_e8 = puVar27;
LAB_0074e3eb:
  sVar15 = BIT_initDStream(&BStack_a8,srcBuffer,cSrcSize - uVar13);
  if (0xffffffffffffff88 < sVar15) {
    return sVar15;
  }
  puVar17 = (undefined1 *)((long)dst + (maxDstSize - 3));
  uVar13 = maxDstSize + 3 >> 2;
  puVar1 = (undefined1 *)((long)dst + uVar13);
  puVar2 = puVar1 + uVar13;
  puVar3 = puVar2 + uVar13;
  puVar14 = (ulong *)((long)cSrc + uVar22 + 0xe);
  cVar12 = (char)uVar10;
  puVar19 = puVar3;
  puVar23 = puVar2;
  puVar29 = puVar1;
  puVar36 = (undefined1 *)dst;
  if (puVar3 < puVar17) {
    bVar16 = -cVar12 & 0x3f;
    lVar11 = uVar13 * 3;
    puVar19 = (undefined1 *)dst;
    do {
      puVar36 = puVar19;
      uVar22 = (uStack_110 << ((byte)uVar35 & 0x3f)) >> bVar16;
      uVar25 = (uStack_130 << ((byte)uVar33 & 0x3f)) >> bVar16;
      uVar28 = (uStack_138 << ((byte)uStack_11c & 0x3f)) >> bVar16;
      iVar20 = *(byte *)((long)DTable + uVar22 * 2 + 5) + uVar35;
      uVar30 = (BStack_a8.bitContainer << ((byte)BStack_a8.bitsConsumed & 0x3f)) >> bVar16;
      uVar32 = (uStack_110 << ((byte)iVar20 & 0x3f)) >> bVar16;
      *puVar36 = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      iVar21 = *(byte *)((long)DTable + uVar25 * 2 + 5) + uVar33;
      puVar36[uVar13] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
      iVar24 = *(byte *)((long)DTable + uVar28 * 2 + 5) + uStack_11c;
      puVar36[uVar13 * 2] = *(undefined1 *)((long)DTable + uVar28 * 2 + 4);
      iVar26 = *(byte *)((long)DTable + uVar30 * 2 + 5) + BStack_a8.bitsConsumed;
      puVar36[lVar11] = *(undefined1 *)((long)DTable + uVar30 * 2 + 4);
      uVar22 = (uStack_130 << ((byte)iVar21 & 0x3f)) >> bVar16;
      uVar25 = (uStack_138 << ((byte)iVar24 & 0x3f)) >> bVar16;
      iVar20 = (uint)*(byte *)((long)DTable + uVar32 * 2 + 5) + iVar20;
      uVar28 = (BStack_a8.bitContainer << ((byte)iVar26 & 0x3f)) >> bVar16;
      uVar30 = (uStack_110 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar36[1] = *(undefined1 *)((long)DTable + uVar32 * 2 + 4);
      iVar21 = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + iVar21;
      puVar36[uVar13 + 1] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      iVar24 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar24;
      puVar36[uVar13 * 2 + 1] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
      iVar26 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 5) + iVar26;
      puVar36[lVar11 + 1] = *(undefined1 *)((long)DTable + uVar28 * 2 + 4);
      iVar20 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 5) + iVar20;
      puVar36[2] = *(undefined1 *)((long)DTable + uVar30 * 2 + 4);
      uVar22 = (uStack_130 << ((byte)iVar21 & 0x3f)) >> bVar16;
      uVar25 = (uStack_138 << ((byte)iVar24 & 0x3f)) >> bVar16;
      iVar21 = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + iVar21;
      uVar28 = (BStack_a8.bitContainer << ((byte)iVar26 & 0x3f)) >> bVar16;
      uVar30 = (uStack_110 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar36[uVar13 + 2] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      iVar24 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar24;
      puVar36[uVar13 * 2 + 2] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
      iVar26 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 5) + iVar26;
      puVar36[lVar11 + 2] = *(undefined1 *)((long)DTable + uVar28 * 2 + 4);
      uVar35 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 5) + iVar20;
      puVar36[3] = *(undefined1 *)((long)DTable + uVar30 * 2 + 4);
      uVar22 = (uStack_130 << ((byte)iVar21 & 0x3f)) >> bVar16;
      bVar4 = *(byte *)((long)DTable + uVar22 * 2 + 5);
      puVar36[uVar13 + 3] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      uVar22 = (uStack_138 << ((byte)iVar24 & 0x3f)) >> bVar16;
      bVar5 = *(byte *)((long)DTable + uVar22 * 2 + 5);
      puVar36[uVar13 * 2 + 3] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      uVar22 = (BStack_a8.bitContainer << ((byte)iVar26 & 0x3f)) >> bVar16;
      bVar6 = *(byte *)((long)DTable + uVar22 * 2 + 5);
      puVar36[lVar11 + 3] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      iVar20 = 3;
      if (puStack_108 < (ulong *)((long)cSrc + 0xe)) {
        iStack_d4 = 3;
      }
      else {
        puStack_108 = (ulong *)((long)puStack_108 - (ulong)(uVar35 >> 3));
        uVar35 = uVar35 & 7;
        uStack_110 = *puStack_108;
        iStack_d4 = 0;
      }
      uVar33 = iVar21 + (uint)bVar4;
      if (puVar14 <= puStack_f8) {
        puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)(uVar33 >> 3));
        uVar33 = uVar33 & 7;
        uStack_130 = *puStack_f8;
        iVar20 = 0;
      }
      uStack_11c = iVar24 + (uint)bVar5;
      iVar24 = 3;
      if (puStack_e8 < puVar27 + 1) {
        iVar21 = 3;
      }
      else {
        puStack_e8 = (ulong *)((long)puStack_e8 - (ulong)(uStack_11c >> 3));
        uStack_11c = uStack_11c & 7;
        uStack_138 = *puStack_e8;
        iVar21 = 0;
      }
      BStack_a8.bitsConsumed = iVar26 + (uint)bVar6;
      if (BStack_a8.limitPtr <= BStack_a8.ptr) {
        BStack_a8.ptr = (char *)((long)BStack_a8.ptr - (ulong)(BStack_a8.bitsConsumed >> 3));
        BStack_a8.bitsConsumed = BStack_a8.bitsConsumed & 7;
        BStack_a8.bitContainer = *(size_t *)BStack_a8.ptr;
        iVar24 = 0;
      }
    } while ((puVar36 + lVar11 + 4 < puVar17) &&
            (puVar19 = puVar36 + 4, ((iVar20 == 0 && iStack_d4 == 0) && iVar21 == 0) && iVar24 == 0)
            );
    puVar36 = puVar36 + 4;
    puVar19 = puVar36 + lVar11;
    puVar23 = puVar36 + uVar13 * 2;
    puVar29 = puVar36 + uVar13;
  }
  if ((puVar1 < puVar36) || (puVar2 < puVar29)) {
    return 0xffffffffffffffec;
  }
  if (puVar3 < puVar23) {
    return 0xffffffffffffffec;
  }
  if (uVar35 < 0x41) {
    bVar16 = -cVar12 & 0x3f;
    puVar31 = puStack_108;
    do {
      if (puVar31 < (ulong *)((long)cSrc + 0xe)) {
        puStack_108 = puStack_80;
        if (puVar31 == puStack_80) break;
        bVar37 = puStack_80 <= (ulong *)((long)puVar31 - (ulong)(uVar35 >> 3));
        uVar18 = (int)puVar31 - (int)puStack_80;
        if (bVar37) {
          uVar18 = uVar35 >> 3;
        }
        uVar35 = uVar35 + uVar18 * -8;
      }
      else {
        uVar18 = uVar35 >> 3;
        uVar35 = uVar35 & 7;
        bVar37 = true;
      }
      puStack_108 = (ulong *)((long)puVar31 - (ulong)uVar18);
      uStack_110 = *puStack_108;
      if ((puVar1 + -3 <= puVar36) || (!bVar37)) break;
      uVar13 = (uStack_110 << ((byte)uVar35 & 0x3f)) >> bVar16;
      iVar20 = *(byte *)((long)DTable + uVar13 * 2 + 5) + uVar35;
      *puVar36 = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar13 = (uStack_110 << ((byte)iVar20 & 0x3f)) >> bVar16;
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar20;
      uVar22 = (uStack_110 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar36[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + iVar20;
      uVar13 = (uStack_110 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar36[2] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      uVar35 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar20;
      puVar36[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      puVar36 = puVar36 + 4;
      puVar31 = puStack_108;
      if (0x40 < uVar35) break;
    } while( true );
  }
  if (puVar36 < puVar1) {
    do {
      uVar13 = (uStack_110 << ((byte)uVar35 & 0x3f)) >> (-cVar12 & 0x3fU);
      uVar35 = *(byte *)((long)DTable + uVar13 * 2 + 5) + uVar35;
      *puVar36 = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      puVar36 = puVar36 + 1;
    } while (puVar36 < puVar1);
  }
  uVar13 = (ulong)uVar33;
  puVar31 = puStack_f8;
  if (uVar33 < 0x41) {
    bVar16 = -cVar12 & 0x3f;
    do {
      if (puStack_f8 < puVar14) {
        puVar31 = puVar34;
        if (puStack_f8 == puVar34) break;
        bVar37 = puVar34 <= (ulong *)((long)puStack_f8 - (uVar13 >> 3));
        uVar33 = (int)puStack_f8 - (int)puVar34;
        if (bVar37) {
          uVar33 = (uint)(uVar13 >> 3);
        }
        uVar18 = (uint)uVar13 + uVar33 * -8;
      }
      else {
        uVar33 = (uint)(uVar13 >> 3);
        uVar18 = (uint)uVar13 & 7;
        bVar37 = true;
      }
      uVar13 = (ulong)uVar18;
      puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)uVar33);
      uStack_130 = *puStack_f8;
      puVar31 = puStack_f8;
      if ((puVar2 + -3 <= puVar29) || (!bVar37)) break;
      uVar13 = (uStack_130 << ((byte)uVar18 & 0x3f)) >> bVar16;
      iVar20 = *(byte *)((long)DTable + uVar13 * 2 + 5) + uVar18;
      *puVar29 = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar22 = (uStack_130 << ((byte)iVar20 & 0x3f)) >> bVar16;
      iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + iVar20;
      uVar13 = (uStack_130 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar29[1] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar20;
      uVar22 = (uStack_130 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar29[2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar33 = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + iVar20;
      uVar13 = (ulong)uVar33;
      puVar29[3] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      puVar29 = puVar29 + 4;
      if (0x40 < uVar33) break;
    } while( true );
  }
  puStack_f8 = puVar31;
  if (puVar29 < puVar2) {
    do {
      uVar22 = (uStack_130 << ((byte)uVar13 & 0x3f)) >> (-cVar12 & 0x3fU);
      uVar33 = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + (int)uVar13;
      *puVar29 = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      puVar29 = puVar29 + 1;
      uVar13 = (ulong)uVar33;
    } while (puVar29 < puVar2);
  }
  else {
    uVar33 = (uint)uVar13;
  }
  puVar14 = puStack_e8;
  if (uStack_11c < 0x41) {
    bVar16 = -cVar12 & 0x3f;
    do {
      if (puStack_e8 < puVar27 + 1) {
        puVar14 = puVar27;
        if (puStack_e8 == puVar27) break;
        bVar37 = puVar27 <= (ulong *)((long)puStack_e8 - (ulong)(uStack_11c >> 3));
        uVar18 = (int)puStack_e8 - (int)puVar27;
        if (bVar37) {
          uVar18 = uStack_11c >> 3;
        }
        uStack_11c = uStack_11c + uVar18 * -8;
      }
      else {
        uVar18 = uStack_11c >> 3;
        uStack_11c = uStack_11c & 7;
        bVar37 = true;
      }
      puStack_e8 = (ulong *)((long)puStack_e8 - (ulong)uVar18);
      uStack_138 = *puStack_e8;
      puVar14 = puStack_e8;
      if ((puVar3 + -3 <= puVar23) || (!bVar37)) break;
      uVar13 = (uStack_138 << ((byte)uStack_11c & 0x3f)) >> bVar16;
      iVar20 = *(byte *)((long)DTable + uVar13 * 2 + 5) + uStack_11c;
      *puVar23 = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar22 = (uStack_138 << ((byte)iVar20 & 0x3f)) >> bVar16;
      iVar20 = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + iVar20;
      uVar13 = (uStack_138 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar23[1] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar20;
      uVar22 = (uStack_138 << ((byte)iVar20 & 0x3f)) >> bVar16;
      puVar23[2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uStack_11c = (uint)*(byte *)((long)DTable + uVar22 * 2 + 5) + iVar20;
      puVar23[3] = *(undefined1 *)((long)DTable + uVar22 * 2 + 4);
      puVar23 = puVar23 + 4;
      if (0x40 < uStack_11c) break;
    } while( true );
  }
  if (puVar23 < puVar3) {
    do {
      uVar13 = (uStack_138 << ((byte)uStack_11c & 0x3f)) >> (-cVar12 & 0x3fU);
      uStack_11c = *(byte *)((long)DTable + uVar13 * 2 + 5) + uStack_11c;
      *puVar23 = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      puVar23 = puVar23 + 1;
    } while (puVar23 < puVar3);
  }
  if (BStack_a8.bitsConsumed < 0x41) {
    bVar16 = -cVar12 & 0x3f;
    do {
      if (BStack_a8.ptr < BStack_a8.limitPtr) {
        if (BStack_a8.ptr == BStack_a8.start) break;
        bVar37 = BStack_a8.start <=
                 (size_t *)((long)BStack_a8.ptr - (ulong)(BStack_a8.bitsConsumed >> 3));
        uVar13 = (ulong)(uint)((int)BStack_a8.ptr - (int)BStack_a8.start);
        if (bVar37) {
          uVar13 = (ulong)(BStack_a8.bitsConsumed >> 3);
        }
        BStack_a8.bitsConsumed = BStack_a8.bitsConsumed + (int)uVar13 * -8;
      }
      else {
        uVar13 = (ulong)(BStack_a8.bitsConsumed >> 3);
        BStack_a8.bitsConsumed = BStack_a8.bitsConsumed & 7;
        bVar37 = true;
      }
      BStack_a8.ptr = (char *)((long)BStack_a8.ptr - uVar13);
      BStack_a8.bitContainer = *(size_t *)BStack_a8.ptr;
      if ((puVar17 <= puVar19) || (!bVar37)) break;
      uVar13 = (BStack_a8.bitContainer << ((byte)BStack_a8.bitsConsumed & 0x3f)) >> bVar16;
      iVar20 = *(byte *)((long)DTable + uVar13 * 2 + 5) + BStack_a8.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar13 = (BStack_a8.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar16;
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar20;
      puVar19[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar13 = (BStack_a8.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar16;
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar20;
      puVar19[2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar13 = (BStack_a8.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar16;
      BStack_a8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar20;
      puVar19[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      puVar19 = puVar19 + 4;
      if (0x40 < BStack_a8.bitsConsumed) break;
    } while( true );
  }
  if (puVar19 < (undefined1 *)((long)dst + maxDstSize)) {
    do {
      uVar13 = (BStack_a8.bitContainer << ((byte)BStack_a8.bitsConsumed & 0x3f)) >>
               (-cVar12 & 0x3fU);
      BStack_a8.bitsConsumed = *(byte *)((long)DTable + uVar13 * 2 + 5) + BStack_a8.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      puVar19 = puVar19 + 1;
    } while (puVar19 < (undefined1 *)((long)dst + maxDstSize));
  }
  if (BStack_a8.bitsConsumed != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_a8.ptr != BStack_a8.start) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_11c != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar14 != puVar27) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uVar33 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_f8 != puVar34) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uVar35 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_108 != puStack_80) {
    return 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize,
                                    const void* cSrc, size_t cSrcSize,
                                    const HUF_DTable* DTable)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#endif
}